

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# av1_cx_iface.c
# Opt level: O2

aom_codec_err_t ctrl_set_svc_params(aom_codec_alg_priv_t_conflict *ctx,__va_list_tag *args)

{
  undefined4 uVar1;
  undefined4 uVar2;
  uint uVar3;
  int iVar4;
  AV1_PRIMARY *ppi;
  AV1_COMP *cpi;
  uint *puVar5;
  LAYER_CONTEXT *pLVar6;
  undefined1 auVar7 [16];
  _Bool _Var8;
  uint uVar9;
  aom_codec_err_t aVar10;
  undefined8 *puVar11;
  ulong uVar12;
  long lVar13;
  uint uVar14;
  long lVar15;
  long lVar16;
  uint uVar17;
  int iVar18;
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  int iVar21;
  int iVar22;
  ulong uVar23;
  
  ppi = ctx->ppi;
  cpi = ppi->cpi;
  uVar9 = args->gp_offset;
  if ((ulong)uVar9 < 0x29) {
    puVar11 = (undefined8 *)((ulong)uVar9 + (long)args->reg_save_area);
    args->gp_offset = uVar9 + 8;
  }
  else {
    puVar11 = (undefined8 *)args->overflow_arg_area;
    args->overflow_arg_area = puVar11 + 1;
  }
  puVar5 = (uint *)*puVar11;
  uVar9 = *puVar5;
  ppi->number_spatial_layers = uVar9;
  uVar14 = puVar5[1];
  ppi->number_temporal_layers = uVar14;
  (cpi->svc).number_spatial_layers = uVar9;
  (cpi->svc).number_temporal_layers = uVar14;
  uVar3 = (cpi->svc).prev_number_temporal_layers;
  if (((uVar3 != 0) && (uVar17 = (cpi->svc).prev_number_spatial_layers, uVar17 != 0)) &&
     ((uVar14 != uVar3 || (uVar9 != uVar17)))) {
    (ppi->seq_params).operating_points_cnt_minus_1 = uVar14 * uVar9 + -1;
    *(byte *)&ctx->next_frame_flags = (byte)ctx->next_frame_flags | 1;
    av1_set_svc_seq_params(ppi);
    uVar23._0_4_ = (cpi->svc).spatial_layer_id;
    uVar23._4_4_ = (cpi->svc).temporal_layer_id;
    uVar1 = (cpi->svc).number_spatial_layers;
    uVar2 = (cpi->svc).number_temporal_layers;
    iVar21 = uVar1 + -1;
    iVar22 = uVar2 + -1;
    auVar20._0_8_ =
         CONCAT44(-(uint)((int)uVar23._4_4_ < iVar22),-(uint)((int)(undefined4)uVar23 < iVar21));
    auVar20._8_8_ = 0;
    auVar19._8_8_ = 0;
    auVar19._0_8_ = uVar23 & auVar20._0_8_;
    auVar7._4_4_ = iVar22;
    auVar7._0_4_ = iVar21;
    auVar7._8_4_ = 0xffffffff;
    auVar7._12_4_ = 0xffffffff;
    auVar19 = ~auVar20 & auVar7 | auVar19;
    uVar23 = CONCAT44(-(uint)(0 < auVar19._4_4_),-(uint)(0 < auVar19._0_4_)) & auVar19._0_8_;
    (cpi->svc).spatial_layer_id = (int)uVar23;
    (cpi->svc).temporal_layer_id = (int)(uVar23 >> 0x20);
    iVar18 = (cpi->common).temporal_layer_id;
    iVar4 = (cpi->common).spatial_layer_id;
    if (iVar4 < iVar21) {
      iVar21 = iVar4;
    }
    if (iVar21 < 1) {
      iVar21 = 0;
    }
    if (iVar18 < iVar22) {
      iVar22 = iVar18;
    }
    if (iVar22 < 1) {
      iVar22 = 0;
    }
    (cpi->common).spatial_layer_id = iVar21;
    (cpi->common).temporal_layer_id = iVar22;
    uVar14 = ppi->number_temporal_layers;
    uVar9 = ppi->number_spatial_layers;
  }
  if ((uVar9 < 2) && (uVar14 < 2)) {
    if (ppi->seq_params_locked == 0) {
LAB_001809b8:
      aVar10 = update_encoder_cfg(ctx);
      return aVar10;
    }
  }
  else {
    ctx->ppi->use_svc = 1;
    uVar14 = uVar14 * uVar9;
    uVar23 = 0;
    uVar12 = 0;
    if (0 < (int)uVar14) {
      uVar12 = (ulong)uVar14;
    }
    while (uVar12 != uVar23) {
      lVar16 = uVar23 + 2;
      if (0x3f < (int)puVar5[lVar16]) {
        return AOM_CODEC_INVALID_PARAM;
      }
      lVar15 = uVar23 + 0x22;
      if ((int)puVar5[lVar15] < 0) {
        return AOM_CODEC_INVALID_PARAM;
      }
      uVar23 = uVar23 + 1;
      if ((int)puVar5[lVar16] < (int)puVar5[lVar15]) {
        return AOM_CODEC_INVALID_PARAM;
      }
    }
    _Var8 = av1_alloc_layer_context(cpi,uVar14);
    if (!_Var8) {
      return AOM_CODEC_MEM_ERROR;
    }
    uVar9 = ppi->number_spatial_layers;
    lVar16 = 0;
    for (uVar23 = 0; uVar23 != uVar9; uVar23 = uVar23 + 1) {
      uVar14 = ppi->number_temporal_layers;
      lVar15 = 0;
      while( true ) {
        uVar3 = (uint)lVar15;
        if (uVar3 == uVar14) break;
        pLVar6 = (cpi->svc).layer_context;
        lVar13 = (long)(int)((int)uVar23 * uVar14 + uVar3);
        pLVar6[lVar13].max_q = puVar5[lVar13 + 2];
        pLVar6[lVar13].min_q = puVar5[lVar13 + 0x22];
        uVar17 = puVar5[uVar23 + 0x42];
        if ((int)puVar5[uVar23 + 0x42] < 2) {
          uVar17 = 1;
        }
        pLVar6[lVar13].scaling_factor_num = uVar17;
        uVar17 = puVar5[uVar23 + 0x46];
        if ((int)uVar17 < 2) {
          uVar17 = 1;
        }
        pLVar6[lVar13].scaling_factor_den = uVar17;
        iVar18 = puVar5[lVar13 + 0x4a] * 1000;
        if (0x20c49b < (int)puVar5[lVar13 + 0x4a]) {
          iVar18 = 0x7fffffff;
        }
        pLVar6[lVar13].layer_target_bitrate = (long)iVar18;
        pLVar6[lVar13].framerate_factor = puVar5[lVar15 + 0x6a];
        lVar13 = (long)iVar18;
        if (uVar3 - uVar14 != -1) {
          lVar13 = 0;
        }
        lVar16 = lVar16 + lVar13;
        lVar15 = lVar15 + 1;
      }
    }
    if (ppi->seq_params_locked == 0) {
      (cpi->oxcf).rc_cfg.target_bandwidth = lVar16;
      (ctx->oxcf).rc_cfg.target_bandwidth = lVar16;
      (ppi->seq_params).operating_points_cnt_minus_1 = uVar9 * ppi->number_temporal_layers + -1;
      av1_init_layer_context(cpi);
      goto LAB_001809b8;
    }
    (cpi->oxcf).rc_cfg.target_bandwidth = lVar16;
    (ctx->oxcf).rc_cfg.target_bandwidth = lVar16;
    set_primary_rc_buffer_sizes(&cpi->oxcf,ppi);
    av1_update_layer_context_change_config(cpi,lVar16);
    check_reset_rc_flag(cpi);
  }
  av1_check_fpmt_config(ctx->ppi,&ctx->ppi->cpi->oxcf);
  return AOM_CODEC_OK;
}

Assistant:

static aom_codec_err_t ctrl_set_svc_params(aom_codec_alg_priv_t *ctx,
                                           va_list args) {
  AV1_PRIMARY *const ppi = ctx->ppi;
  AV1_COMP *const cpi = ppi->cpi;
  aom_svc_params_t *const params = va_arg(args, aom_svc_params_t *);
  int64_t target_bandwidth = 0;
  ppi->number_spatial_layers = params->number_spatial_layers;
  ppi->number_temporal_layers = params->number_temporal_layers;
  cpi->svc.number_spatial_layers = params->number_spatial_layers;
  cpi->svc.number_temporal_layers = params->number_temporal_layers;
  // Sequence parameters (operating_points_cnt_minus_1, operating_point_idc[])
  // need to be updated if the number of layers have changed.
  // Force a keyframe here and update the two relevant sequence parameters.
  if (cpi->svc.prev_number_temporal_layers &&
      cpi->svc.prev_number_spatial_layers &&
      (cpi->svc.number_temporal_layers !=
           cpi->svc.prev_number_temporal_layers ||
       cpi->svc.number_spatial_layers != cpi->svc.prev_number_spatial_layers)) {
    SequenceHeader *const seq_params = &ppi->seq_params;
    seq_params->operating_points_cnt_minus_1 =
        ppi->number_spatial_layers * ppi->number_temporal_layers - 1;
    ctx->next_frame_flags |= AOM_EFLAG_FORCE_KF;
    av1_set_svc_seq_params(ppi);
    // Check for valid values for the spatial/temporal_layer_id here, since
    // there has been a dynamic change in the number_spatial/temporal_layers,
    // and if the ctrl_set_layer_id is not used after this call, the
    // previous (last_encoded) values of spatial/temporal_layer_id will be used,
    // which may be invalid.
    cpi->svc.spatial_layer_id = AOMMAX(
        0,
        AOMMIN(cpi->svc.spatial_layer_id, cpi->svc.number_spatial_layers - 1));
    cpi->svc.temporal_layer_id =
        AOMMAX(0, AOMMIN(cpi->svc.temporal_layer_id,
                         cpi->svc.number_temporal_layers - 1));
    cpi->common.spatial_layer_id =
        AOMMAX(0, AOMMIN(cpi->common.spatial_layer_id,
                         cpi->svc.number_spatial_layers - 1));
    cpi->common.temporal_layer_id =
        AOMMAX(0, AOMMIN(cpi->common.temporal_layer_id,
                         cpi->svc.number_temporal_layers - 1));
  }

  if (ppi->number_spatial_layers > 1 || ppi->number_temporal_layers > 1) {
    unsigned int sl, tl;
    ctx->ppi->use_svc = 1;
    const int num_layers =
        ppi->number_spatial_layers * ppi->number_temporal_layers;
    for (int layer = 0; layer < num_layers; ++layer) {
      if (params->max_quantizers[layer] > 63 ||
          params->min_quantizers[layer] < 0 ||
          params->min_quantizers[layer] > params->max_quantizers[layer]) {
        return AOM_CODEC_INVALID_PARAM;
      }
    }
    if (!av1_alloc_layer_context(cpi, num_layers)) return AOM_CODEC_MEM_ERROR;

    for (sl = 0; sl < ppi->number_spatial_layers; ++sl) {
      for (tl = 0; tl < ppi->number_temporal_layers; ++tl) {
        const int layer = LAYER_IDS_TO_IDX(sl, tl, ppi->number_temporal_layers);
        LAYER_CONTEXT *lc = &cpi->svc.layer_context[layer];
        lc->max_q = params->max_quantizers[layer];
        lc->min_q = params->min_quantizers[layer];
        lc->scaling_factor_num = AOMMAX(1, params->scaling_factor_num[sl]);
        lc->scaling_factor_den = AOMMAX(1, params->scaling_factor_den[sl]);
        const int layer_target_bitrate = params->layer_target_bitrate[layer];
        if (layer_target_bitrate > INT_MAX / 1000) {
          lc->layer_target_bitrate = INT_MAX;
        } else {
          lc->layer_target_bitrate = 1000 * layer_target_bitrate;
        }
        lc->framerate_factor = params->framerate_factor[tl];
        if (tl == ppi->number_temporal_layers - 1)
          target_bandwidth += lc->layer_target_bitrate;
      }
    }

    if (ppi->seq_params_locked) {
      AV1EncoderConfig *const oxcf = &cpi->oxcf;
      // Keep ctx->oxcf in sync in case further codec controls are made prior
      // to encoding.
      ctx->oxcf.rc_cfg.target_bandwidth = oxcf->rc_cfg.target_bandwidth =
          target_bandwidth;
      set_primary_rc_buffer_sizes(oxcf, ppi);
      av1_update_layer_context_change_config(cpi, target_bandwidth);
      check_reset_rc_flag(cpi);
    } else {
      // Note av1_init_layer_context() relies on cpi->oxcf. The order of that
      // call and the ones in the other half of this block (which
      // update_encoder_cfg() transitively makes) is important. So we keep
      // ctx->oxcf and cpi->oxcf in sync here as update_encoder_cfg() will
      // overwrite cpi->oxcf with ctx->oxcf.
      ctx->oxcf.rc_cfg.target_bandwidth = cpi->oxcf.rc_cfg.target_bandwidth =
          target_bandwidth;
      SequenceHeader *const seq_params = &ppi->seq_params;
      seq_params->operating_points_cnt_minus_1 =
          ppi->number_spatial_layers * ppi->number_temporal_layers - 1;

      av1_init_layer_context(cpi);
      // update_encoder_cfg() is somewhat costly and this control may be called
      // multiple times, so update_encoder_cfg() is only called to ensure frame
      // and superblock sizes are updated before they're fixed by the first
      // encode call.
      return update_encoder_cfg(ctx);
    }
  } else if (!ppi->seq_params_locked) {
    // Ensure frame and superblock sizes are updated.
    return update_encoder_cfg(ctx);
  }
  av1_check_fpmt_config(ctx->ppi, &ctx->ppi->cpi->oxcf);
  return AOM_CODEC_OK;
}